

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int hostcache_entry_is_stale(void *datap,void *hc)

{
  long lVar1;
  time_t age;
  Curl_dns_entry *dns;
  hostcache_prune_data *prune;
  void *hc_local;
  void *datap_local;
  
  if (*(long *)((long)hc + 8) != 0) {
    lVar1 = *datap - *(long *)((long)hc + 8);
    if (*(int *)((long)datap + 0x10) <= lVar1) {
      return 1;
    }
    if (*(long *)((long)datap + 8) < lVar1) {
      *(long *)((long)datap + 8) = lVar1;
    }
  }
  return 0;
}

Assistant:

static int
hostcache_entry_is_stale(void *datap, void *hc)
{
  struct hostcache_prune_data *prune =
    (struct hostcache_prune_data *) datap;
  struct Curl_dns_entry *dns = (struct Curl_dns_entry *) hc;

  if(dns->timestamp) {
    /* age in seconds */
    time_t age = prune->now - dns->timestamp;
    if(age >= prune->max_age_sec)
      return TRUE;
    if(age > prune->oldest)
      prune->oldest = age;
  }
  return FALSE;
}